

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtShared *pBt_00;
  BtCursor *local_28;
  BtCursor *pPrev;
  BtShared *pBt;
  Btree *pBtree;
  BtCursor *pCur_local;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBt_00 = pCur->pBt;
    sqlite3BtreeEnter(p);
    if (pBt_00->pCursor == pCur) {
      pBt_00->pCursor = pCur->pNext;
    }
    else {
      local_28 = pBt_00->pCursor;
      do {
        if (local_28->pNext == pCur) {
          local_28->pNext = pCur->pNext;
          break;
        }
        local_28 = local_28->pNext;
      } while (local_28 != (BtCursor *)0x0);
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt_00);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    if (((pBt_00->openFlags & 4) == 0) || (pBt_00->pCursor != (BtCursor *)0x0)) {
      sqlite3BtreeLeave(p);
    }
    else {
      sqlite3BtreeClose(p);
    }
    pCur->pBtree = (Btree *)0x0;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    if( (pBt->openFlags & BTREE_SINGLE) && pBt->pCursor==0 ){
      /* Since the BtShared is not sharable, there is no need to
      ** worry about the missing sqlite3BtreeLeave() call here.  */
      assert( pBtree->sharable==0 );
      sqlite3BtreeClose(pBtree);
    }else{
      sqlite3BtreeLeave(pBtree);
    }
    pCur->pBtree = 0;
  }
  return SQLITE_OK;
}